

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arun.cpp
# Opt level: O1

rotation_t * opengv::math::arun(rotation_t *__return_storage_ptr__,MatrixXd *Hcross)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double *pdVar13;
  double *pdVar14;
  long lVar15;
  ActualDstType actualDst;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  type tmp;
  Matrix3d U;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVDcross;
  double local_2d8;
  double dStack_2d0;
  double local_2c8 [4];
  double local_2a8 [4];
  double local_288;
  double local_278 [9];
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> local_230;
  
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD(&local_230,Hcross,0x14);
  dVar9 = *local_230.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
           m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data;
  dVar10 = local_230.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
           m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data[1];
  dVar11 = local_230.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
           m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data[2];
  local_2d8 = local_230.
              super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
              m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data[local_230.
                     super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                     m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows + 1];
  dStack_2d0 = (local_230.
                super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_data +
               local_230.
               super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
               m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows + 1)[1];
  auVar17 = *(undefined1 (*) [16])
             (local_230.
              super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
              m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data + local_230.
                       super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                       .m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows * 2);
  dVar1 = local_230.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
          m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data[local_230.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows * 2 + 2];
  pdVar13 = local_2a8 + 0xc;
  local_278[0] = *local_230.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data;
  local_278[1] = local_230.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data[1];
  local_278[2] = local_230.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data[2];
  local_278[3] = local_230.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data[3];
  local_278[4] = local_230.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data
                 [local_230.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows + 1];
  local_278[5] = (local_230.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data +
                 local_230.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows + 1)[1];
  local_278[6] = local_230.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data
                 [local_230.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows * 2];
  local_278[7] = (local_230.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data +
                 local_230.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows * 2)[1];
  local_278[8] = local_230.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data
                 [local_230.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows * 2 + 2];
  auVar12._8_8_ = local_2d8;
  auVar12._0_8_ =
       local_230.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
       m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       [3];
  pdVar14 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
            m_storage.m_data.array + 2;
  lVar15 = 6;
  do {
    dVar2 = local_2a8[lVar15];
    auVar21._0_8_ = dVar9 * dVar2;
    auVar21._8_8_ = dVar10 * dVar2;
    auVar16._8_8_ = local_2a8[lVar15 + 3];
    auVar16._0_8_ = local_2a8[lVar15 + 3];
    auVar16 = vfmadd231pd_avx512vl(auVar21,auVar12,auVar16);
    auVar5._8_8_ = local_2a8[lVar15 + 6];
    auVar5._0_8_ = local_2a8[lVar15 + 6];
    auVar16 = vfmadd231pd_avx512vl(auVar16,auVar17,auVar5);
    *(undefined1 (*) [16])((plain_array<double,_9,_0,_0> *)(pdVar14 + -2))->array = auVar16;
    *pdVar14 = dVar2 * dVar11 + dVar1 * local_2a8[lVar15 + 6] + dStack_2d0 * local_2a8[lVar15 + 3];
    lVar15 = lVar15 + 1;
    pdVar14 = pdVar14 + 3;
  } while (lVar15 != 9);
  dVar2 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
          m_storage.m_data.array[4];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar2;
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
       m_storage.m_data.array[8];
  dVar3 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
          m_storage.m_data.array[7];
  dVar4 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
          m_storage.m_data.array[5];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar4;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar4 * dVar3;
  auVar16 = vfmsub231sd_fma(auVar25,auVar18,auVar20);
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
       m_storage.m_data.array[1];
  dVar4 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
          m_storage.m_data.array[2];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar4 * dVar3;
  auVar5 = vfmsub231sd_fma(auVar22,auVar26,auVar20);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar4 * dVar2;
  auVar21 = vfmsub231sd_fma(auVar19,auVar26,auVar24);
  if (auVar21._0_8_ *
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
      m_storage.m_data.array[6] +
      (auVar16._0_8_ *
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
       m_storage.m_data.array[0] -
      auVar5._0_8_ *
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
      m_storage.m_data.array[3]) < 0.0) {
    auVar6._8_8_ = 0x8000000000000000;
    auVar6._0_8_ = 0x8000000000000000;
    auVar17 = vxorpd_avx512vl(auVar17,auVar6);
    lVar15 = 2;
    do {
      dVar2 = pdVar13[-6];
      auVar23._0_8_ = dVar9 * dVar2;
      auVar23._8_8_ = dVar10 * dVar2;
      auVar7._8_8_ = pdVar13[-3];
      auVar7._0_8_ = pdVar13[-3];
      auVar16 = vfmadd231pd_avx512vl(auVar23,auVar12,auVar7);
      auVar8._8_8_ = *pdVar13;
      auVar8._0_8_ = *pdVar13;
      auVar16 = vfmadd231pd_avx512vl(auVar16,auVar17,auVar8);
      *(undefined1 (*) [16])(&local_2d8 + lVar15) = auVar16;
      local_2c8[lVar15] = dVar11 * dVar2 + (dStack_2d0 * pdVar13[-3] - dVar1 * *pdVar13);
      lVar15 = lVar15 + 3;
      pdVar13 = pdVar13 + 1;
    } while (lVar15 != 0xb);
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
    .m_data.array[0] = local_2c8[0];
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
    .m_data.array[1] = local_2c8[1];
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
    .m_data.array[2] = local_2c8[2];
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
    .m_data.array[3] = local_2c8[3];
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
    .m_data.array[4] = local_2a8[0];
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
    .m_data.array[5] = local_2a8[1];
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
    .m_data.array[6] = local_2a8[2];
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
    .m_data.array[7] = local_2a8[3];
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
    .m_data.array[8] = local_288;
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(&local_230);
  return __return_storage_ptr__;
}

Assistant:

opengv::rotation_t
opengv::math::arun( const Eigen::MatrixXd & Hcross )
{
  //decompose matrix H to obtain rotation
  Eigen::JacobiSVD< Eigen::MatrixXd > SVDcross(
      Hcross,
      Eigen::ComputeFullU | Eigen::ComputeFullV );

  Eigen::Matrix3d V = SVDcross.matrixV();
  Eigen::Matrix3d U = SVDcross.matrixU();
  rotation_t R = V * U.transpose();

  //modify the result in case the rotation has determinant=-1
  if( R.determinant() < 0 )
  {
    Eigen::Matrix3d V_prime;
    V_prime.col(0) = V.col(0);
    V_prime.col(1) = V.col(1);
    V_prime.col(2) = -V.col(2);
    R = V_prime * U.transpose();
  }

  return R;
}